

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

tcg_target_ulong cpu_tb_exec(CPUState *cpu,TranslationBlock *itb)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  CPUClass *pCVar4;
  ulong uVar5;
  CPUClass *cc;
  uint8_t *tb_ptr;
  int tb_exit;
  TranslationBlock *last_tb;
  uintptr_t ret;
  CPUArchState_conflict28 *env;
  TranslationBlock *itb_local;
  CPUState *cpu_local;
  
  pvVar2 = cpu->env_ptr;
  uVar3._0_4_ = itb->cflags;
  uVar3._4_4_ = itb->trace_vcpu_dstate;
  tb_exec_lock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
  uVar5 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x2e8) + 0x90))(pvVar2,uVar3);
  if (cpu->uc->nested_level == 1) {
    tb_exec_unlock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
  }
  cpu->can_do_io = 1;
  if (1 < ((uint)uVar5 & 3)) {
    pCVar4 = cpu->cc;
    if ((((*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x358) == 0) &&
         (iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x2c8) + 0x578), 2 < iVar1 - 6U)) &&
        (2 < iVar1 - 0xcU)) && ((2 < iVar1 - 0x10U && ((cpu->uc->quit_request & 1U) == 0)))) {
      if (pCVar4->synchronize_from_tb ==
          (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
        if (pCVar4->set_pc == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
          __assert_fail("cc->set_pc",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0x61,"tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
        }
        (*pCVar4->set_pc)((CPUState_conflict *)cpu,
                          (vaddr)((TranslationBlock_conflict *)(uVar5 & 0xfffffffffffffffc))->pc);
      }
      else {
        (*pCVar4->synchronize_from_tb)
                  ((CPUState_conflict *)cpu,
                   (TranslationBlock_conflict *)(uVar5 & 0xfffffffffffffffc));
      }
    }
    cpu->tcg_exit_req = 0;
  }
  return uVar5;
}

Assistant:

static inline tcg_target_ulong cpu_tb_exec(CPUState *cpu, TranslationBlock *itb)
{
    CPUArchState *env = cpu->env_ptr;
    uintptr_t ret;
    TranslationBlock *last_tb;
    int tb_exit;
    uint8_t *tb_ptr = itb->tc.ptr;

    UC_TRACE_START(UC_TRACE_TB_EXEC);
    tb_exec_lock(cpu->uc->tcg_ctx);
    ret = tcg_qemu_tb_exec(env, tb_ptr);
    if (cpu->uc->nested_level == 1) {
        // Only unlock (allow writing to JIT area) if we are the outmost uc_emu_start
        tb_exec_unlock(cpu->uc->tcg_ctx);
    }
    UC_TRACE_END(UC_TRACE_TB_EXEC, "[uc] exec tb 0x%" PRIx64 ": ", itb->pc);

    cpu->can_do_io = 1;
    last_tb = (TranslationBlock *)(ret & ~TB_EXIT_MASK);
    tb_exit = ret & TB_EXIT_MASK;
    // trace_exec_tb_exit(last_tb, tb_exit);

    if (tb_exit > TB_EXIT_IDX1) {
        /* We didn't start executing this TB (eg because the instruction
         * counter hit zero); we must restore the guest PC to the address
         * of the start of the TB.
         */
        CPUClass *cc = CPU_GET_CLASS(cpu);
        if (!HOOK_EXISTS(env->uc, UC_HOOK_CODE)) {
            // We should sync pc for R/W error.
            switch (env->uc->invalid_error) {
                case UC_ERR_WRITE_PROT:
                case UC_ERR_READ_PROT:
                case UC_ERR_FETCH_PROT:
                case UC_ERR_WRITE_UNMAPPED:
                case UC_ERR_READ_UNMAPPED:
                case UC_ERR_FETCH_UNMAPPED:
                case UC_ERR_WRITE_UNALIGNED:
                case UC_ERR_READ_UNALIGNED:
                case UC_ERR_FETCH_UNALIGNED:
                    break;
                default:
                    // If we receive a quit request, users has sync-ed PC themselves.
                    if (!cpu->uc->quit_request) {
                        if (cc->synchronize_from_tb) {
                            cc->synchronize_from_tb(cpu, last_tb);
                        } else {
                            assert(cc->set_pc);
                            cc->set_pc(cpu, last_tb->pc);
                        }
                    }
            }
        }

        cpu->tcg_exit_req = 0;
    }
    return ret;
}